

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::execute(Executor *this,Values *initial)

{
  shared_ptr<Node> local_38;
  undefined1 local_28 [8];
  SharedPtr<Node> root;
  Values *initial_local;
  Executor *this_local;
  
  root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)initial;
  std::make_shared<Node,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  std::shared_ptr<Node>::shared_ptr(&local_38,(shared_ptr<Node> *)local_28);
  OpenList::addLast(&this->m_openList,&local_38);
  std::shared_ptr<Node>::~shared_ptr(&local_38);
  executeBFS(this);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_28);
  return;
}

Assistant:

void Executor::execute(Values initial)
{
    SharedPtr<Node> root = std::make_shared<Node>(std::move(initial));
    m_openList.addLast(std::move(root));

    executeBFS();
}